

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

void * pthSocketThread(void *x)

{
  int iVar1;
  int iVar2;
  int *__arg;
  long lVar3;
  int optval;
  int c;
  pthread_t thr;
  pthread_attr_t attr;
  sockaddr_storage client;
  undefined4 local_f8;
  socklen_t local_f4;
  pthread_t local_f0;
  pthread_attr_t local_e8;
  sockaddr local_b0 [8];
  
  iVar1 = pthread_attr_init(&local_e8);
  if (iVar1 == 0) {
    iVar1 = pthread_attr_setstacksize(&local_e8,0x40000);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_setdetachstate(&local_e8,1);
      if (iVar1 == 0) {
        listen(fdSock,100);
        local_f4 = 0x80;
        spinWhileStarting();
        do {
          iVar1 = accept(fdSock,local_b0,&local_f4);
          closeOrphanedNotifications(-1,iVar1);
          if ((ulong)(uint)numSockNetAddr == 0) {
LAB_00117304:
            if ((gpioCfg.internals >> 10 & 1) == 0) {
              pthSocketThread_cold_5();
            }
            __arg = (int *)malloc(4);
            *__arg = iVar1;
            local_f8 = 1;
            iVar2 = setsockopt(iVar1,1,9,&local_f8,4);
            if (iVar2 < 0) {
              if ((gpioCfg.internals >> 10 & 1) == 0) {
                pthSocketThread_cold_6();
              }
              close(iVar1);
            }
            if ((gpioCfg.internals >> 10 & 1) == 0) {
              pthSocketThread_cold_7();
            }
            iVar2 = pthread_create(&local_f0,&local_e8,pthSocketThreadHandler,__arg);
            if (iVar2 < 0) {
              if ((gpioCfg.internals >> 10 & 1) != 0) {
                return (void *)0xffffffffffffffff;
              }
              pthSocketThread_cold_8();
              return (void *)0xffffffffffffffff;
            }
          }
          else {
            if ((local_b0[0].sa_family == 2) && (0 < numSockNetAddr)) {
              lVar3 = 0;
              do {
                if (local_b0[0].sa_data._2_4_ == *(int *)((long)sockNetAddr + lVar3))
                goto LAB_00117304;
                lVar3 = lVar3 + 4;
              } while ((ulong)(uint)numSockNetAddr << 2 != lVar3);
            }
            if ((gpioCfg.internals >> 10 & 1) == 0) {
              pthSocketThread_cold_4();
            }
            close(iVar1);
          }
        } while (-1 < iVar1);
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          pthSocketThread_cold_9();
        }
      }
      else if ((gpioCfg.internals >> 10 & 1) == 0) {
        pthSocketThread_cold_3();
      }
    }
    else if ((gpioCfg.internals >> 10 & 1) == 0) {
      pthSocketThread_cold_2();
    }
  }
  else if ((gpioCfg.internals >> 10 & 1) == 0) {
    pthSocketThread_cold_1();
  }
  return (void *)0xffffffffffffffff;
}

Assistant:

static void * pthSocketThread(void *x)
{
   int fdC=0, c, *sock;
   struct sockaddr_storage client;
   pthread_attr_t attr;

   if (pthread_attr_init(&attr))
      SOFT_ERROR((void*)PI_INIT_FAILED,
         "pthread_attr_init failed (%m)");

   if (pthread_attr_setstacksize(&attr, STACK_SIZE))
      SOFT_ERROR((void*)PI_INIT_FAILED,
         "pthread_attr_setstacksize failed (%m)");

   if (pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_DETACHED))
      SOFT_ERROR((void*)PI_INIT_FAILED,
         "pthread_attr_setdetachstate failed (%m)");

   /* fdSock opened in gpioInitialise so that we can treat
      failure to bind as fatal. */

   listen(fdSock, 100);

   c = sizeof(client);

   /* don't start until DMA started */

   spinWhileStarting();

   while (fdC >= 0)
   {
      pthread_t thr;

      fdC = accept(fdSock, (struct sockaddr *)&client, (socklen_t*)&c);

      closeOrphanedNotifications(-1, fdC);

      if (addrAllowed((struct sockaddr *)&client))
      {
         DBG(DBG_ALWAYS, "Connection accepted on socket %d", fdC);

         sock = malloc(sizeof(int));

         *sock = fdC;

         /* Enable tcp_keepalive */
         int optval = 1;
         socklen_t optlen = sizeof(optval);

         if (setsockopt(fdC, SOL_SOCKET, SO_KEEPALIVE, &optval, optlen) < 0) {
           DBG(0, "setsockopt() fail, closing socket %d", fdC);
           close(fdC);
         }

         DBG(DBG_ALWAYS, "SO_KEEPALIVE enabled on socket %d\n", fdC);

         if (pthread_create
            (&thr, &attr, pthSocketThreadHandler, (void*) sock) < 0)
            SOFT_ERROR((void*)PI_INIT_FAILED,
               "socket pthread_create failed (%m)");
      }
      else
      {
         DBG(DBG_ALWAYS, "Connection rejected, closing");
         close(fdC);
      }
   }

   if (fdC < 0)
      SOFT_ERROR((void*)PI_INIT_FAILED, "accept failed (%m)");

   return 0;
}